

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
GraphContigger::end_to_end_solution
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,GraphContigger *this,
          vector<long,_std::allocator<long>_> *p,vector<long,_std::allocator<long>_> *fnids)

{
  _Rb_tree_header *p_Var1;
  pointer plVar2;
  bool bVar3;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var4;
  _Rb_tree_const_iterator<long> _Var5;
  _Base_ptr p_Var6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long *plVar12;
  int x;
  long lVar13;
  _Rb_tree_header *p_Var14;
  long lVar15;
  vector<long,_std::allocator<long>_> sol;
  vector<long,_std::allocator<long>_> csol;
  vector<long,_std::allocator<long>_> a;
  value_type n;
  set<long,_std::less<long>,_std::allocator<long>_> fw_reached_nodes_1;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c0;
  set<long,_std::less<long>,_std::allocator<long>_> fw_skipped;
  set<long,_std::less<long>,_std::allocator<long>_> fw_reached_nodes_2;
  
  uVar10 = 1;
  lVar13 = 8;
  lVar15 = 0;
  for (uVar9 = 0;
      plVar2 = (p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
               _M_start,
      uVar9 < (ulong)((long)(p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)plVar2 >> 3);
      uVar9 = uVar9 + 1) {
    fw_reached_nodes_1._M_t._M_impl._0_8_ = -plVar2[uVar9];
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                      ((fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                       (fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_finish,&fw_reached_nodes_1);
    plVar12 = (fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (_Var4._M_current != plVar12) goto LAB_0021f0d8;
    lVar15 = lVar15 + 8;
    uVar10 = uVar10 + 1;
    lVar13 = lVar13 + 8;
  }
LAB_0021f0eb:
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
  while( true ) {
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                      ((fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_start,plVar12,(long)plVar2 + lVar13);
    plVar12 = (fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    lVar13 = lVar13 + 8;
    uVar10 = uVar11 + 1;
    if (_Var4._M_current != plVar12) break;
LAB_0021f0d8:
    uVar11 = uVar10;
    plVar2 = (p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((ulong)((long)(p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)plVar2 >> 3) <= uVar11)
    goto LAB_0021f0eb;
  }
  sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  plVar2 = (p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar10 = plVar2[uVar9];
  uVar8 = -uVar10;
  if (0 < (long)uVar10) {
    uVar8 = uVar10;
  }
  uVar10 = plVar2[uVar11];
  uVar7 = -uVar10;
  if (0 < (long)uVar10) {
    uVar7 = uVar10;
  }
  uVar11 = uVar11 + 1 & 0xffffffff;
  uVar10 = uVar9;
  if (uVar8 < uVar7) {
    for (; uVar10 < uVar11; uVar10 = uVar10 + 1) {
      std::vector<long,_std::allocator<long>_>::push_back
                (&sol,(value_type_conflict *)
                      ((long)(p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar15));
      lVar15 = lVar15 + 8;
    }
  }
  else {
    for (; uVar10 < uVar11; uVar10 = uVar10 + 1) {
      fw_reached_nodes_1._M_t._M_impl._0_8_ =
           -(p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
            _M_start[uVar10];
      std::vector<long,_std::allocator<long>_>::emplace_back<long>(&sol,(long *)&fw_reached_nodes_1)
      ;
    }
    std::__reverse<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
              (sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_start,sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish);
  }
  csol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  csol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  csol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::push_back
            (&csol,sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start);
  p_Var1 = &fw_reached_nodes_2._M_t._M_impl.super__Rb_tree_header;
  lVar13 = 1;
  do {
    p_Var14 = &fw_reached_nodes_1._M_t._M_impl.super__Rb_tree_header;
    if ((ulong)((long)sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar9) {
      (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_start =
           csol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
      (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           csol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           csol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      csol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      csol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      csol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      break;
    }
    n = sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
        [lVar13];
    DistanceGraph::fw_reached_nodes
              (&fw_reached_nodes_1,*(DistanceGraph **)this,
               csol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_finish[-1],1);
    DistanceGraph::fw_reached_nodes
              (&fw_reached_nodes_2,*(DistanceGraph **)this,
               csol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_finish[-1],2);
    _Var5 = std::
            __find_if<std::_Rb_tree_const_iterator<long>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                      (fw_reached_nodes_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       p_Var14,&n);
    if ((_Rb_tree_header *)_Var5._M_node == p_Var14) {
      _Var5 = std::
              __find_if<std::_Rb_tree_const_iterator<long>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                        (fw_reached_nodes_2._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                         p_Var1,&n);
      if ((_Rb_tree_header *)_Var5._M_node == p_Var1) {
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_start =
             sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start;
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_finish =
             sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
        sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        bVar3 = true;
      }
      else {
        a.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        a.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        a.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)0x0;
        DistanceGraph::fw_reached_nodes
                  ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_c0,
                   *(DistanceGraph **)this,
                   csol.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1],1);
        for (p_Var6 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &local_c0._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          DistanceGraph::fw_reached_nodes
                    (&fw_skipped,*(DistanceGraph **)this,*(sgNodeID_t *)(p_Var6 + 1),1);
          p_Var14 = &fw_skipped._M_t._M_impl.super__Rb_tree_header;
          _Var5 = std::
                  __find_if<std::_Rb_tree_const_iterator<long>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                            (fw_skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_left,p_Var14
                             ,&n);
          if ((_Rb_tree_header *)_Var5._M_node != p_Var14) {
            std::vector<long,_std::allocator<long>_>::push_back
                      (&a,(value_type_conflict *)(p_Var6 + 1));
          }
          lVar15 = (long)a.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)a.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (lVar15 == 8) {
            std::vector<long,_std::allocator<long>_>::push_back
                      (&csol,a.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start);
            std::vector<long,_std::allocator<long>_>::push_back(&csol,&n);
          }
          else {
            (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_start =
                 sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                 ._M_start;
            (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_finish =
                 sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                 ._M_finish;
            (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage;
            sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            sol.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
          }
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          ~_Rb_tree(&fw_skipped._M_t);
          if (lVar15 != 8) {
            bVar3 = true;
            goto LAB_0021f3d5;
          }
        }
        bVar3 = false;
LAB_0021f3d5:
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        ~_Rb_tree(&local_c0);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  (&a.super__Vector_base<long,_std::allocator<long>_>);
        if ((_Rb_tree_header *)p_Var6 == &local_c0._M_impl.super__Rb_tree_header) goto LAB_0021f24a;
      }
    }
    else {
      std::vector<long,_std::allocator<long>_>::push_back(&csol,&n);
LAB_0021f24a:
      bVar3 = false;
    }
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&fw_reached_nodes_2._M_t);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&fw_reached_nodes_1._M_t);
    lVar13 = lVar13 + 1;
  } while (!bVar3);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&csol.super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&sol.super__Vector_base<long,_std::allocator<long>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<sgNodeID_t> GraphContigger::end_to_end_solution(std::vector<sgNodeID_t> p, std::vector<sgNodeID_t> fnids){
    for (auto i=0; i<p.size(); ++i){
        if (std::find(fnids.begin(), fnids.end(), -p[i]) != fnids.end()) {
            for (auto j=i+1; j<p.size(); ++j) {
                if (std::find(fnids.begin(), fnids.end(), p[j])!=fnids.end()){
                    std::vector<sgNodeID_t> sol;
                    if (std::abs(p[i])<std::abs(p[j])){
                        for (auto x=i; x<j+1; ++x) sol.push_back(p[x]);
                    } else {
                        for (auto x=i; x<j+1; ++x) sol.push_back(-p[x]);
                        std::reverse(sol.begin(), sol.end());
                    }
                    std::vector<sgNodeID_t> csol;
                    csol.push_back(sol[0]);
                    for (auto x=1; i<sol.size(); ++x){
                        auto n=sol[x];
                        auto fw_reached_nodes_1 = ws.sdg.fw_reached_nodes(csol.back(),1);
                        auto fw_reached_nodes_2 = ws.sdg.fw_reached_nodes(csol.back(),2);
                        if (std::find(fw_reached_nodes_1.begin(), fw_reached_nodes_1.end(), n)!=fw_reached_nodes_1.end()) {
                            csol.push_back(n);
                        } else if (std::find(fw_reached_nodes_2.begin(), fw_reached_nodes_2.end(), n)!=fw_reached_nodes_2.end()) {
                            std::vector<sgNodeID_t> a;
                            for (const auto& skipped: ws.sdg.fw_reached_nodes(csol.back(),1)) {
                                auto fw_skipped = ws.sdg.fw_reached_nodes(skipped,1);
                                if (std::find(fw_skipped.begin(), fw_skipped.end(), n)!=fw_skipped.end()) a.push_back(skipped);
                                if (a.size()==1) {
                                    csol.push_back(a[0]);
                                    csol.push_back(n);
                                } else {
                                    return sol;
                                }
                            }
                        } else {
//                            for (auto &s: sol) {
//                                std::cout << s << ",";
//                            }
//                            std::cout << std::endl;
                            return sol;
                        }
                    }
                    return csol;
                }
            }
            return std::vector<sgNodeID_t>();
        }
    }
    return std::vector<sgNodeID_t>();
}